

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void * parse_class(Parser *parser,Modifier *modifier)

{
  Token *name;
  Token *data;
  List *extends;
  BlockStmt *block;
  ClassStmt *pCVar1;
  
  name = parser->token;
  expect(parser,ID);
  break_newline(parser);
  extends = new_list();
  if (parser->token->kind != COLON) {
LAB_00104618:
    block = (BlockStmt *)parse_class_block(parser);
    pCVar1 = new_class_stmt(name,extends,block,modifier);
    return pCVar1;
  }
  do {
    bmove(parser);
    do {
      data = parser->token;
      if (data->kind == OP_FL_BRA) goto LAB_00104618;
      expect(parser,ID);
      list_add(extends,data);
    } while (parser->token->kind != COMM);
  } while( true );
}

Assistant:

void *parse_class(Parser *parser, Modifier *modifier) {
    Token *name = token(parser);
    expect(parser, ID);
    break_newline(parser);
    List *extends = new_list();
    // 解析继承关系
    if (token(parser)->kind == COLON) {
        bmove(parser);
        Token *super;
        while ((super = token(parser))->kind != OP_FL_BRA) {
            expect(parser, ID);
            list_add(extends, super);
            if (token(parser)->kind == COMM){
                bmove(parser);
            }
        }
    }
    BlockStmt *block = parse_class_block(parser);
    return new_class_stmt(name, extends, block, modifier);
}